

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

char ** bcf_hdr_seqnames(bcf_hdr_t *h,int *n)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  long lVar4;
  char **ppcVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  
  puVar3 = (uint *)h->dict[1];
  uVar1 = puVar3[1];
  ppcVar5 = (char **)calloc((long)(int)uVar1,8);
  uVar2 = *puVar3;
  if ((ulong)uVar2 != 0) {
    lVar4 = *(long *)(puVar3 + 4);
    lVar6 = 0x28;
    bVar7 = 0;
    uVar8 = 0;
    do {
      if ((*(uint *)(lVar4 + (uVar8 >> 4 & 0xfffffff) * 4) >> (bVar7 & 0x1e) & 3) == 0) {
        if ((int)uVar1 <= *(int *)(*(long *)(puVar3 + 8) + lVar6)) {
          __assert_fail("tid<m",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                        ,0x543,"const char **bcf_hdr_seqnames(const bcf_hdr_t *, int *)");
        }
        ppcVar5[*(int *)(*(long *)(puVar3 + 8) + lVar6)] =
             *(char **)(*(long *)(puVar3 + 6) + uVar8 * 8);
      }
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0x30;
      bVar7 = bVar7 + 2;
    } while (uVar2 != uVar8);
  }
  if (0 < (int)uVar1) {
    uVar8 = 0;
    do {
      if (ppcVar5[uVar8] == (char *)0x0) {
        __assert_fail("names[tid]",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                      ,0x548,"const char **bcf_hdr_seqnames(const bcf_hdr_t *, int *)");
      }
      uVar8 = uVar8 + 1;
    } while (uVar1 != uVar8);
  }
  *n = uVar1;
  return ppcVar5;
}

Assistant:

const char **bcf_hdr_seqnames(const bcf_hdr_t *h, int *n)
{
    vdict_t *d = (vdict_t*)h->dict[BCF_DT_CTG];
    int tid, m = kh_size(d);
    const char **names = (const char**) calloc(m,sizeof(const char*));
    khint_t k;
    for (k=kh_begin(d); k<kh_end(d); k++)
    {
        if ( !kh_exist(d,k) ) continue;
        tid = kh_val(d,k).id;
        assert( tid<m );
        names[tid] = kh_key(d,k);
    }
    // sanity check: there should be no gaps
    for (tid=0; tid<m; tid++)
        assert(names[tid]);
    *n = m;
    return names;
}